

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::ReallocBuffer(FString *this,size_t newlen)

{
  char *to;
  FStringData *pFVar1;
  char *from;
  size_t local_40;
  FStringData *old;
  size_t newlen_local;
  FString *this_local;
  
  pFVar1 = Data(this);
  if (pFVar1->RefCount < 2) {
    pFVar1 = Data(this);
    if (pFVar1->AllocLen < newlen) {
      pFVar1 = Data(this);
      pFVar1 = FStringData::Realloc(pFVar1,newlen);
      this->Chars = (char *)(pFVar1 + 1);
    }
    pFVar1 = Data(this);
    pFVar1->Len = (uint)newlen;
  }
  else {
    pFVar1 = Data(this);
    AllocBuffer(this,newlen);
    to = this->Chars;
    from = FStringData::Chars(pFVar1);
    local_40 = newlen;
    if (pFVar1->Len <= newlen) {
      local_40 = (size_t)pFVar1->Len;
    }
    StrCopy(to,from,local_40);
    FStringData::Release(pFVar1);
  }
  return;
}

Assistant:

void FString::ReallocBuffer (size_t newlen)
{
	if (Data()->RefCount > 1)
	{ // If more than one reference, we must use a new copy
		FStringData *old = Data();
		AllocBuffer (newlen);
		StrCopy (Chars, old->Chars(), newlen < old->Len ? newlen : old->Len);
		old->Release();
	}
	else
	{
		if (newlen > Data()->AllocLen)
		{
			Chars = (char *)(Data()->Realloc(newlen) + 1);
		}
		Data()->Len = (unsigned int)newlen;
	}
}